

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O1

void clean_mud(void)

{
  CHAR_DATA *ch;
  bool bVar1;
  int iVar2;
  MYSQL *pMVar3;
  DESCRIPTOR_DATA *pDVar4;
  CRow *pCVar5;
  char *pcVar6;
  string_view fmt;
  string_view fmt_00;
  CRow row;
  DbConnection riftCore;
  CSQLInterface nSQL;
  char buf [4608];
  char tbuf [4608];
  CRow local_2618;
  DbConnection local_25f8;
  CSQLInterface local_2570;
  char local_2438 [4608];
  char local_1238 [4616];
  
  CSQLInterface::CSQLInterface(&local_2570);
  Config::GetDbConnection(&local_25f8,&local_2570.Settings,"rift");
  bVar1 = CSQLInterface::StartSQLServer
                    (&local_2570,local_25f8.Host._M_dataplus._M_p,local_25f8.Db._M_dataplus._M_p,
                     local_25f8.User._M_dataplus._M_p,local_25f8.Pwd._M_dataplus._M_p);
  if (bVar1) {
    sprintf(local_2438,"DELETE FROM logins WHERE ctime + 5184000 < %ld",current_time);
    pMVar3 = open_conn();
    mysql_query(pMVar3,local_2438);
    mysql_close(pMVar3);
    sprintf(local_2438,"DELETE FROM notes WHERE timestamp + 2592000 < %ld",current_time);
    pMVar3 = open_conn();
    mysql_query(pMVar3,local_2438);
    mysql_close(pMVar3);
    sprintf(local_2438,"DELETE FROM offerings WHERE time + 2592000 < %ld",current_time);
    pMVar3 = open_conn();
    mysql_query(pMVar3,local_2438);
    mysql_close(pMVar3);
    sprintf(local_2438,"DELETE FROM pklogs WHERE ctime + 5184000 < %ld",current_time);
    pMVar3 = open_conn();
    mysql_query(pMVar3,local_2438);
    mysql_close(pMVar3);
    iVar2 = CSQLInterface::Select
                      (&RS.SQL,"name FROM players WHERE lastlogin + 2592000 < %ld",current_time);
    if (iVar2 != 0) {
      pDVar4 = new_descriptor();
      while( true ) {
        bVar1 = CSQLInterface::End(&RS.SQL);
        if (bVar1) break;
        pCVar5 = CSQLInterface::GetRow(&RS.SQL);
        local_2618.maxcol = pCVar5->maxcol;
        local_2618.maxrow = pCVar5->maxrow;
        local_2618.rowpos = pCVar5->rowpos;
        local_2618.row = pCVar5->row;
        pcVar6 = CRow::operator[](&local_2618,0);
        strcpy(local_1238,pcVar6);
        bVar1 = load_char_obj(pDVar4,local_1238);
        if (bVar1) {
          ch = pDVar4->character;
          ch->desc = (DESCRIPTOR_DATA *)0x0;
          if (0x1d < ch->level) {
            perm_death_log(ch,4);
          }
          delete_char(pDVar4->character->true_name,true);
        }
        else {
          free_char(pDVar4->character);
        }
      }
      free_descriptor(pDVar4);
    }
    iVar2 = CSQLInterface::Select(&RS.SQL,"name FROM players");
    if (iVar2 != 0) {
      pDVar4 = new_descriptor();
      while( true ) {
        bVar1 = CSQLInterface::End(&RS.SQL);
        if (bVar1) break;
        pCVar5 = CSQLInterface::GetRow(&RS.SQL);
        local_2618.maxcol = pCVar5->maxcol;
        local_2618.maxrow = pCVar5->maxrow;
        local_2618.rowpos = pCVar5->rowpos;
        local_2618.row = pCVar5->row;
        pcVar6 = CRow::operator[](&local_2618,0);
        strcpy(local_1238,pcVar6);
        bVar1 = load_char_obj(pDVar4,local_1238);
        if (!bVar1) {
          pcVar6 = CRow::operator[](&local_2618,0);
          CSQLInterface::Delete(&local_2570,"players WHERE name = \'%s\'",pcVar6);
          fmt_00._M_str = "Deleting player...";
          fmt_00._M_len = 0x12;
          CLogger::Info<>((CLogger *)&RS.field_0x140,fmt_00);
        }
        free_char(pDVar4->character);
      }
      free_descriptor(pDVar4);
    }
  }
  else {
    fmt._M_str = "clean_mud: failed to establish a database connection.";
    fmt._M_len = 0x35;
    CLogger::Error<>((CLogger *)&RS.field_0x140,fmt);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25f8.Pwd._M_dataplus._M_p != &local_25f8.Pwd.field_2) {
    operator_delete(local_25f8.Pwd._M_dataplus._M_p,local_25f8.Pwd.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25f8.User._M_dataplus._M_p != &local_25f8.User.field_2) {
    operator_delete(local_25f8.User._M_dataplus._M_p,
                    local_25f8.User.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25f8.Host._M_dataplus._M_p != &local_25f8.Host.field_2) {
    operator_delete(local_25f8.Host._M_dataplus._M_p,
                    local_25f8.Host.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_25f8.Db._M_dataplus._M_p != &local_25f8.Db.field_2) {
    operator_delete(local_25f8.Db._M_dataplus._M_p,local_25f8.Db.field_2._M_allocated_capacity + 1);
  }
  CSQLInterface::~CSQLInterface(&local_2570);
  return;
}

Assistant:

void clean_mud()
{
	char buf[MSL], tbuf[MSL];
	int cres = 0;
	CRow row;
	CSQLInterface nSQL;
	DESCRIPTOR_DATA *d;

	DbConnection riftCore = nSQL.Settings.GetDbConnection("rift");
	if (!nSQL.StartSQLServer(riftCore.Host.c_str(),
		riftCore.Db.c_str(), riftCore.User.c_str(), riftCore.Pwd.c_str()))
	{
		RS.Logger.Error("clean_mud: failed to establish a database connection.");
		return;
	}

	// 5184000 = one month

	sprintf(buf, "DELETE FROM logins WHERE ctime + 5184000 < %ld", current_time);
	one_query(buf);

	sprintf(buf, "DELETE FROM notes WHERE timestamp + 2592000 < %ld", current_time);
	one_query(buf);

	sprintf(buf, "DELETE FROM offerings WHERE time + 2592000 < %ld", current_time);
	one_query(buf);

	sprintf(buf, "DELETE FROM pklogs WHERE ctime + 5184000 < %ld", current_time);
	one_query(buf);

	// autodelete...
	cres = RS.SQL.Select("name FROM players WHERE lastlogin + 2592000 < %ld", current_time);

	if (cres)
	{
		d = new_descriptor();

		while (!RS.SQL.End())
		{
			row = RS.SQL.GetRow();
			strcpy(&tbuf[0], row[0]);

			if (!load_char_obj(d, tbuf))
			{
				free_char(d->character);
				continue;
			}

			d->character->desc = nullptr;

			if (d->character->level >= 30)
				perm_death_log(d->character, 4);

			delete_char(d->character->true_name, true);
		}

		free_descriptor(d);
	}

	// compare db to pfiles
	cres = RS.SQL.Select("name FROM players");

	if (cres)
	{
		d = new_descriptor();

		while (!RS.SQL.End())
		{
			row = RS.SQL.GetRow();
			strcpy(&tbuf[0], row[0]);

			if (!load_char_obj(d, tbuf))
			{
				nSQL.Delete("players WHERE name = '%s'", row[0]);
				RS.Logger.Info("Deleting player...");
			}

			free_char(d->character);
		}

		free_descriptor(d);
	}
}